

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXR(float **out_rgba,int *width,int *height,char *filename,char **err)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  float *pfVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  
  if (out_rgba == (float **)0x0) {
    iVar2 = -3;
    if (err == (char **)0x0) {
      return -3;
    }
    pcVar7 = "Invalid argument.\n";
  }
  else {
    memset(&exr_header,0,0x10890);
    exr_image.tiles = (EXRTile *)0x0;
    exr_image.images._0_4_ = 0;
    exr_image.images._4_4_ = 0;
    exr_image.width = 0;
    exr_image.height = 0;
    exr_image.num_channels = 0;
    iVar2 = ParseEXRVersionFromFile(&exr_version,filename);
    if (iVar2 != 0) {
      return iVar2;
    }
    if (exr_version.non_image == 0 && exr_version.multipart == 0) {
      iVar2 = ParseEXRHeaderFromFile(&exr_header,&exr_version,filename,err);
      if (iVar2 != 0) {
        return iVar2;
      }
      for (lVar8 = 0; lVar8 < exr_header.num_channels; lVar8 = lVar8 + 1) {
        if (exr_header.pixel_types[lVar8] == 1) {
          exr_header.requested_pixel_types[lVar8] = 2;
        }
      }
      iVar3 = LoadEXRImageFromFile(&exr_image,&exr_header,filename,err);
      iVar2 = exr_image.width;
      if (iVar3 != 0) {
        return iVar3;
      }
      uVar9 = 0;
      uVar4 = (ulong)(uint)exr_header.num_channels;
      if (exr_header.num_channels < 1) {
        uVar4 = uVar9;
      }
      pcVar7 = (exr_header.channels)->name + 1;
      uVar13 = 0xffffffffffffffff;
      uVar12 = 0xffffffff;
      uVar11 = 0xffffffff;
      uVar10 = 0xffffffff;
      for (; uVar4 != uVar9; uVar9 = uVar9 + 1) {
        cVar1 = ((EXRChannelInfo *)(pcVar7 + -1))->name[0];
        if (cVar1 == 'R') {
          if (*pcVar7 == '\0') {
            uVar13 = uVar9 & 0xffffffff;
          }
        }
        else if (cVar1 == 'A') {
          if (*pcVar7 == '\0') {
            uVar10 = uVar9 & 0xffffffff;
          }
        }
        else if (cVar1 == 'B') {
          if (*pcVar7 == '\0') {
            uVar11 = uVar9 & 0xffffffff;
          }
        }
        else if ((cVar1 == 'G') && (*pcVar7 == '\0')) {
          uVar12 = uVar9 & 0xffffffff;
        }
        pcVar7 = pcVar7 + 0x110;
      }
      if ((int)uVar13 == -1) {
        iVar2 = -4;
        if (err == (char **)0x0) {
          return -4;
        }
        pcVar7 = "R channel not found\n";
      }
      else if ((int)uVar12 == -1) {
        iVar2 = -4;
        if (err == (char **)0x0) {
          return -4;
        }
        pcVar7 = "G channel not found\n";
      }
      else {
        if ((int)uVar11 != -1) {
          iVar3 = exr_image.height;
          pfVar5 = (float *)malloc((long)exr_image.width * (long)exr_image.height * 0x10);
          *out_rgba = pfVar5;
          uVar6 = iVar3 * iVar2;
          lVar8 = CONCAT44(exr_image.images._4_4_,exr_image.images._0_4_);
          uVar9 = 0;
          uVar4 = (ulong)uVar6;
          if ((int)uVar6 < 1) {
            uVar4 = uVar9;
          }
          for (; uVar4 * 4 != uVar9; uVar9 = uVar9 + 4) {
            pfVar5[uVar9] = *(float *)(*(long *)(lVar8 + (long)(int)uVar13 * 8) + uVar9);
            pfVar5[uVar9 + 1] = *(float *)(*(long *)(lVar8 + (long)(int)uVar12 * 8) + uVar9);
            pfVar5[uVar9 + 2] = *(float *)(*(long *)(lVar8 + (long)(int)uVar11 * 8) + uVar9);
            fVar14 = 1.0;
            if ((int)uVar10 != -1) {
              fVar14 = *(float *)(*(long *)(lVar8 + (long)(int)uVar10 * 8) + uVar9);
            }
            pfVar5[uVar9 + 3] = fVar14;
          }
          *width = iVar2;
          *height = iVar3;
          FreeEXRHeader(&exr_header);
          return 0;
        }
        iVar2 = -4;
        if (err == (char **)0x0) {
          return -4;
        }
        pcVar7 = "B channel not found\n";
      }
    }
    else {
      iVar2 = -4;
      if (err == (char **)0x0) {
        return -4;
      }
      pcVar7 = "Loading multipart or DeepImage is not supported yet.\n";
    }
  }
  *err = pcVar7;
  return iVar2;
}

Assistant:

int LoadEXR(float **out_rgba, int *width, int *height, const char *filename,
            const char **err) {
  if (out_rgba == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      if (err) {
        (*err) = "Loading multipart or DeepImage is not supported yet.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  (*out_rgba) = reinterpret_cast<float *>(
      malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
             static_cast<size_t>(exr_image.height)));
  for (int i = 0; i < exr_image.width * exr_image.height; i++) {
    (*out_rgba)[4 * i + 0] =
        reinterpret_cast<float **>(exr_image.images)[idxR][i];
    (*out_rgba)[4 * i + 1] =
        reinterpret_cast<float **>(exr_image.images)[idxG][i];
    (*out_rgba)[4 * i + 2] =
        reinterpret_cast<float **>(exr_image.images)[idxB][i];
    if (idxA != -1) {
      (*out_rgba)[4 * i + 3] =
          reinterpret_cast<float **>(exr_image.images)[idxA][i];
    } else {
      (*out_rgba)[4 * i + 3] = 1.0;
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);

  return TINYEXR_SUCCESS;
}